

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_tanh>(Mat *a,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long *in_RDI;
  float fVar7;
  int iVar8;
  float fVar10;
  float fVar11;
  undefined1 auVar9 [16];
  float fVar12;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tanh op;
  Mat *m;
  __m128 two;
  __m128 one;
  __m128 one_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_2;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_858;
  undefined8 uStack_850;
  int local_844;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined4 local_828;
  long local_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined8 local_800;
  float *local_7f8;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  undefined1 local_7d1 [9];
  long *local_7c8;
  undefined1 local_7bd;
  int local_7bc;
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  undefined8 *local_798;
  float *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  float *local_778;
  long local_770;
  undefined4 local_764;
  long local_760;
  float *local_758;
  undefined4 local_74c;
  int local_748;
  int local_744;
  undefined8 *local_740;
  undefined4 local_734;
  long local_730;
  undefined8 *local_720;
  undefined8 *local_6f8;
  undefined1 *local_6f0;
  float *local_6e8;
  undefined1 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined4 local_688;
  undefined4 uStack_684;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 uStack_664;
  undefined4 uStack_660;
  undefined4 uStack_65c;
  undefined4 local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  float *local_358;
  float *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328 [2];
  float afStack_320 [2];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 *local_300;
  float *local_2f8;
  float *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float local_2c8 [2];
  float afStack_2c0 [2];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  float local_208 [2];
  float afStack_200 [2];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8 [2];
  float afStack_1a0 [2];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148 [2];
  float afStack_140 [2];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8 [2];
  float afStack_e0 [2];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88 [2];
  float afStack_80 [2];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_7d8 = *(int *)((long)in_RDI + 0x2c);
  local_7dc = (int)in_RDI[6];
  local_7e0 = *(int *)((long)in_RDI + 0x34);
  local_7e4 = (int)in_RDI[7];
  local_7e8 = (int)in_RDI[3];
  local_7ec = local_7d8 * local_7dc * local_7e0 * local_7e8;
  local_7c8 = in_RDI;
  for (local_7f0 = 0; local_7f0 < local_7e4; local_7f0 = local_7f0 + 1) {
    local_7b0 = &local_840;
    local_744 = *(int *)((long)local_7c8 + 0x2c);
    local_748 = (int)local_7c8[6];
    local_74c = *(undefined4 *)((long)local_7c8 + 0x34);
    local_758 = (float *)(*local_7c8 + local_7c8[8] * (long)local_7f0 * local_7c8[2]);
    local_760 = local_7c8[2];
    local_764 = (undefined4)local_7c8[3];
    local_770 = local_7c8[4];
    local_740 = &local_840;
    local_730 = (long)local_744 * (long)local_748 * local_760;
    local_7a8 = &local_840;
    local_798 = &local_840;
    local_734 = 0x10;
    local_7bc = local_7f0;
    local_7bd = 1;
    local_840 = 0;
    local_830 = 0;
    local_828 = 0;
    local_818 = 0;
    local_814 = 0;
    local_810 = 0;
    local_80c = 0;
    local_808 = 0;
    local_800 = 0;
    local_838 = 0;
    local_7f8 = local_758;
    for (local_844 = 0; local_720 = local_798, local_820 = local_770, local_844 + 3 < local_7ec;
        local_844 = local_844 + 4) {
      local_790 = local_7f8;
      local_6b8 = *(undefined8 *)local_7f8;
      uStack_6b0 = *(undefined8 *)(local_7f8 + 2);
      local_6f0 = local_7d1;
      local_6f8 = &local_858;
      local_64c = 0x3f800000;
      local_668 = 0x3f800000;
      local_6c8 = 0x3f8000003f800000;
      uStack_6c0 = 0x3f8000003f800000;
      local_66c = 0x40000000;
      local_688 = 0x40000000;
      local_6d8 = 0x4000000040000000;
      uStack_6d0 = 0x4000000040000000;
      local_618._0_4_ = (float)local_6b8;
      local_618._4_4_ = (float)((ulong)local_6b8 >> 0x20);
      uStack_610._0_4_ = (float)uStack_6b0;
      uStack_610._4_4_ = (float)((ulong)uStack_6b0 >> 0x20);
      local_5f8 = (float)local_618 * 2.0;
      fStack_5f4 = local_618._4_4_ * 2.0;
      fStack_5f0 = (float)uStack_610 * 2.0;
      fStack_5ec = uStack_610._4_4_ * 2.0;
      local_59c = 0x3f800000;
      local_5b8 = 0x3f800000;
      local_608 = 0x3f8000003f800000;
      uStack_600 = 0x3f8000003f800000;
      local_5c8 = 0;
      uStack_5c0 = 0;
      local_5d8 = 0;
      uStack_5d0 = 0;
      local_5e8 = CONCAT44(fStack_5f4,local_5f8);
      uStack_5e0 = CONCAT44(fStack_5ec,fStack_5f0);
      local_528 = CONCAT44(0.0 - fStack_5f4,0.0 - local_5f8);
      uStack_520._0_4_ = 0.0 - fStack_5f0;
      uStack_520._4_4_ = 0.0 - fStack_5ec;
      local_4c8 = 0;
      uStack_4c0 = 0;
      local_568 = 0x3f8000003f800000;
      uStack_560 = 0x3f8000003f800000;
      local_3f8 = local_528;
      uStack_3f0 = uStack_520;
      local_408 = 0x42b0c0a542b0c0a5;
      uStack_400 = 0x42b0c0a542b0c0a5;
      auVar3._8_8_ = uStack_520;
      auVar3._0_8_ = local_528;
      auVar9._8_8_ = 0x42b0c0a542b0c0a5;
      auVar9._0_8_ = 0x42b0c0a542b0c0a5;
      auVar9 = minps(auVar3,auVar9);
      local_528 = auVar9._0_8_;
      local_3d8 = local_528;
      uStack_520 = auVar9._8_8_;
      uStack_3d0 = uStack_520;
      local_3e8 = 0xc2b0c0a5c2b0c0a5;
      uStack_3e0 = 0xc2b0c0a5c2b0c0a5;
      auVar4._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9 = maxps(auVar9,auVar4);
      local_528 = auVar9._0_8_;
      uVar1 = local_528;
      uStack_520 = auVar9._8_8_;
      uVar2 = uStack_520;
      local_428 = 0x3fb8aa3b3fb8aa3b;
      uStack_420 = 0x3fb8aa3b3fb8aa3b;
      local_418._0_4_ = auVar9._0_4_;
      local_418._4_4_ = auVar9._4_4_;
      uStack_410._0_4_ = auVar9._8_4_;
      uStack_410._4_4_ = auVar9._12_4_;
      local_398 = CONCAT44(local_418._4_4_ * 1.442695,(float)local_418 * 1.442695);
      uStack_390 = CONCAT44(uStack_410._4_4_ * 1.442695,(float)uStack_410 * 1.442695);
      local_3a8 = 0x3f0000003f000000;
      uStack_3a0 = 0x3f0000003f000000;
      fVar7 = (float)local_418 * 1.442695 + 0.5;
      fVar10 = local_418._4_4_ * 1.442695 + 0.5;
      fVar11 = (float)uStack_410 * 1.442695 + 0.5;
      fVar12 = uStack_410._4_4_ * 1.442695 + 0.5;
      local_498 = CONCAT44(fVar10,fVar7);
      uStack_490 = CONCAT44(fVar12,fVar11);
      local_4b8 = CONCAT44((int)fVar10,(int)fVar7);
      uStack_4b0 = CONCAT44((int)fVar12,(int)fVar11);
      local_548 = (float)(int)fVar7;
      fStack_544 = (float)(int)fVar10;
      fStack_540 = (float)(int)fVar11;
      fStack_53c = (float)(int)fVar12;
      local_538 = CONCAT44(fStack_544,local_548);
      uStack_530 = CONCAT44(fStack_53c,fStack_540);
      local_478 = local_538;
      uStack_470 = uStack_530;
      local_488 = CONCAT44(fVar10,fVar7);
      uStack_480 = CONCAT44(fVar12,fVar11);
      local_578 = CONCAT44(-(uint)(fVar10 < fStack_544),-(uint)(fVar7 < local_548));
      uStack_570 = CONCAT44(-(uint)(fVar12 < fStack_53c),-(uint)(fVar11 < fStack_540));
      local_4f8 = local_578;
      uStack_4f0 = uStack_570;
      local_508 = 0x3f8000003f800000;
      uStack_500 = 0x3f8000003f800000;
      local_578 = local_578 & 0x3f8000003f800000;
      uStack_570 = uStack_570 & 0x3f8000003f800000;
      local_4d8 = local_538;
      uStack_4d0 = uStack_530;
      local_4e8._0_4_ = (float)local_578;
      local_4e8._4_4_ = (float)(local_578 >> 0x20);
      uStack_4e0._0_4_ = (float)uStack_570;
      uStack_4e0._4_4_ = (float)(uStack_570 >> 0x20);
      local_548 = local_548 - (float)local_4e8;
      fStack_544 = fStack_544 - local_4e8._4_4_;
      fStack_540 = fStack_540 - (float)uStack_4e0;
      fStack_53c = fStack_53c - uStack_4e0._4_4_;
      local_350 = &local_548;
      local_2f8 = ::_ps_cephes_exp_C1;
      local_360 = &local_528;
      local_2d8 = local_528;
      uStack_2d0 = uStack_520;
      local_2b8 = CONCAT44(fStack_544,local_548);
      uStack_2b0 = CONCAT44(fStack_53c,fStack_540);
      local_2c8[0] = 0.6933594;
      local_2c8[1] = 0.6933594;
      afStack_2c0[0] = 0.6933594;
      afStack_2c0[1] = 0.6933594;
      local_2e8 = local_548 * 0.6933594;
      fStack_2e4 = fStack_544 * 0.6933594;
      fStack_2e0 = fStack_540 * 0.6933594;
      fStack_2dc = fStack_53c * 0.6933594;
      local_528 = CONCAT44(local_418._4_4_ - fStack_2e4,(float)local_418 - local_2e8);
      uStack_520._0_4_ = (float)uStack_410 - fStack_2e0;
      uStack_520._4_4_ = uStack_410._4_4_ - fStack_2dc;
      local_358 = ::_ps_cephes_exp_C2;
      local_338 = local_528;
      uStack_330 = uStack_520;
      local_318 = CONCAT44(fStack_544,local_548);
      uStack_310 = CONCAT44(fStack_53c,fStack_540);
      local_328[0] = -0.00021219444;
      local_328[1] = -0.00021219444;
      afStack_320[0] = -0.00021219444;
      afStack_320[1] = -0.00021219444;
      local_348 = local_548 * -0.00021219444;
      fStack_344 = fStack_544 * -0.00021219444;
      fStack_340 = fStack_540 * -0.00021219444;
      fStack_33c = fStack_53c * -0.00021219444;
      fVar7 = ((float)local_418 - local_2e8) - local_348;
      fVar10 = (local_418._4_4_ - fStack_2e4) - fStack_344;
      fVar11 = ((float)uStack_410 - fStack_2e0) - fStack_340;
      fVar12 = (uStack_410._4_4_ - fStack_2dc) - fStack_33c;
      local_528 = CONCAT44(fVar10,fVar7);
      uStack_520._0_4_ = fVar11;
      uStack_520._4_4_ = fVar12;
      local_448 = local_528;
      uStack_440 = uStack_520;
      local_538 = CONCAT44(fVar10 * fVar10,fVar7 * fVar7);
      uStack_530 = CONCAT44(fVar12 * fVar12,fVar11 * fVar11);
      local_290 = &local_588;
      local_c0 = ::_ps_cephes_exp_p1;
      local_98 = 0x3950696739506967;
      uStack_90 = 0x3950696739506967;
      local_a8 = local_528;
      uStack_a0 = uStack_520;
      local_78 = fVar7 * 0.00019875691;
      fStack_74 = fVar10 * 0.00019875691;
      fStack_70 = fVar11 * 0.00019875691;
      fStack_6c = fVar12 * 0.00019875691;
      local_88[0] = 0.0013981999;
      local_88[1] = 0.0013981999;
      afStack_80[0] = 0.0013981999;
      afStack_80[1] = 0.0013981999;
      local_588 = CONCAT44(fStack_74 + 0.0013981999,local_78 + 0.0013981999);
      uStack_580 = CONCAT44(fStack_6c + 0.0013981999,fStack_70 + 0.0013981999);
      local_120 = ::_ps_cephes_exp_p2;
      local_f8 = local_588;
      uStack_f0 = uStack_580;
      local_108 = local_528;
      uStack_100 = uStack_520;
      local_d8 = (local_78 + 0.0013981999) * fVar7;
      fStack_d4 = (fStack_74 + 0.0013981999) * fVar10;
      fStack_d0 = (fStack_70 + 0.0013981999) * fVar11;
      fStack_cc = (fStack_6c + 0.0013981999) * fVar12;
      local_e8[0] = 0.008333452;
      local_e8[1] = 0.008333452;
      afStack_e0[0] = 0.008333452;
      afStack_e0[1] = 0.008333452;
      local_588 = CONCAT44(fStack_d4 + 0.008333452,local_d8 + 0.008333452);
      uStack_580 = CONCAT44(fStack_cc + 0.008333452,fStack_d0 + 0.008333452);
      local_180 = ::_ps_cephes_exp_p3;
      local_158 = local_588;
      uStack_150 = uStack_580;
      local_168 = local_528;
      uStack_160 = uStack_520;
      local_138 = (local_d8 + 0.008333452) * fVar7;
      fStack_134 = (fStack_d4 + 0.008333452) * fVar10;
      fStack_130 = (fStack_d0 + 0.008333452) * fVar11;
      fStack_12c = (fStack_cc + 0.008333452) * fVar12;
      local_148[0] = 0.041665796;
      local_148[1] = 0.041665796;
      afStack_140[0] = 0.041665796;
      afStack_140[1] = 0.041665796;
      local_588 = CONCAT44(fStack_134 + 0.041665796,local_138 + 0.041665796);
      uStack_580 = CONCAT44(fStack_12c + 0.041665796,fStack_130 + 0.041665796);
      local_1e0 = ::_ps_cephes_exp_p4;
      local_1b8 = local_588;
      uStack_1b0 = uStack_580;
      local_1c8 = local_528;
      uStack_1c0 = uStack_520;
      local_198 = (local_138 + 0.041665796) * fVar7;
      fStack_194 = (fStack_134 + 0.041665796) * fVar10;
      fStack_190 = (fStack_130 + 0.041665796) * fVar11;
      fStack_18c = (fStack_12c + 0.041665796) * fVar12;
      local_1a8[0] = 0.16666666;
      local_1a8[1] = 0.16666666;
      afStack_1a0[0] = 0.16666666;
      afStack_1a0[1] = 0.16666666;
      local_588 = CONCAT44(fStack_194 + 0.16666666,local_198 + 0.16666666);
      uStack_580 = CONCAT44(fStack_18c + 0.16666666,fStack_190 + 0.16666666);
      local_240 = ::_ps_cephes_exp_p5;
      local_218 = local_588;
      uStack_210 = uStack_580;
      local_228 = local_528;
      uStack_220 = uStack_520;
      local_1f8 = (local_198 + 0.16666666) * fVar7;
      fStack_1f4 = (fStack_194 + 0.16666666) * fVar10;
      fStack_1f0 = (fStack_190 + 0.16666666) * fVar11;
      fStack_1ec = (fStack_18c + 0.16666666) * fVar12;
      local_208[0] = 0.5;
      local_208[1] = 0.5;
      afStack_200[0] = 0.5;
      afStack_200[1] = 0.5;
      local_588 = CONCAT44(fStack_1f4 + 0.5,local_1f8 + 0.5);
      uStack_580 = CONCAT44(fStack_1ec + 0.5,fStack_1f0 + 0.5);
      local_298 = &local_538;
      local_278 = local_588;
      uStack_270 = uStack_580;
      local_288 = local_538;
      uStack_280 = uStack_530;
      local_258 = (local_1f8 + 0.5) * fVar7 * fVar7;
      fStack_254 = (fStack_1f4 + 0.5) * fVar10 * fVar10;
      fStack_250 = (fStack_1f0 + 0.5) * fVar11 * fVar11;
      fStack_24c = (fStack_1ec + 0.5) * fVar12 * fVar12;
      local_268 = local_528;
      uStack_260 = uStack_520;
      local_588 = CONCAT44(fStack_254 + fVar10,local_258 + fVar7);
      uStack_580 = CONCAT44(fStack_24c + fVar12,fStack_250 + fVar11);
      local_3b8 = local_588;
      uStack_3b0 = uStack_580;
      local_3c8 = 0x3f8000003f800000;
      uStack_3c0 = 0x3f8000003f800000;
      local_28 = local_258 + fVar7 + 1.0;
      fStack_24 = fStack_254 + fVar10 + 1.0;
      fStack_20 = fStack_250 + fVar11 + 1.0;
      fStack_1c = fStack_24c + fVar12 + 1.0;
      local_588 = CONCAT44(fStack_24,local_28);
      uStack_580 = CONCAT44(fStack_1c,fStack_20);
      local_4a8 = CONCAT44(fStack_544,local_548);
      uStack_4a0 = CONCAT44(fStack_53c,fStack_540);
      local_58 = CONCAT44((int)fStack_544,(int)local_548);
      uStack_50 = CONCAT44((int)fStack_53c,(int)fStack_540);
      local_68 = 0x7f0000007f;
      uStack_60 = 0x7f0000007f;
      iVar8 = (int)local_548 + 0x7f;
      fStack_554 = (float)((int)fStack_544 + 0x7f);
      fStack_550 = (float)((int)fStack_540 + 0x7f);
      fStack_54c = (float)((int)fStack_53c + 0x7f);
      local_38 = CONCAT44(fStack_554,iVar8);
      uStack_30 = CONCAT44(fStack_54c,fStack_550);
      local_3c = 0x17;
      local_558 = (float)(iVar8 * 0x800000);
      local_598 = CONCAT44(fStack_554,local_558);
      uStack_590 = CONCAT44(fStack_54c,fStack_550);
      local_458 = local_588;
      uStack_450 = uStack_580;
      local_28 = local_28 * local_558;
      fStack_24 = fStack_24 * fStack_554;
      fStack_20 = fStack_20 * fStack_550;
      fStack_1c = fStack_1c * fStack_54c;
      local_588 = CONCAT44(fStack_24,local_28);
      uStack_580 = CONCAT44(fStack_1c,fStack_20);
      local_388 = local_588;
      uStack_380 = uStack_580;
      local_28 = local_28 + 1.0;
      fStack_24 = fStack_24 + 1.0;
      fStack_20 = fStack_20 + 1.0;
      fStack_1c = fStack_1c + 1.0;
      auVar6._8_8_ = 0x3f8000003f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      auVar5._4_4_ = fStack_24;
      auVar5._0_4_ = local_28;
      auVar5._8_4_ = fStack_20;
      auVar5._12_4_ = fStack_1c;
      _local_638 = divps(auVar6,auVar5);
      local_698 = (float)local_638._0_4_ * 2.0;
      fStack_694 = (float)local_638._4_4_ * 2.0;
      fStack_690 = fStack_630 * 2.0;
      fStack_68c = fStack_62c * 2.0;
      local_858 = CONCAT44(fStack_694 - 1.0,local_698 - 1.0);
      uStack_850 = CONCAT44(fStack_68c - 1.0,fStack_690 - 1.0);
      local_778 = local_7f8;
      local_788 = local_858;
      uStack_780 = uStack_850;
      *local_7f8 = local_698 - 1.0;
      local_7f8[1] = fStack_694 - 1.0;
      local_7f8[2] = fStack_690 - 1.0;
      local_7f8[3] = fStack_68c - 1.0;
      local_7f8 = local_7f8 + 4;
      local_6a8 = local_6c8;
      uStack_6a0 = uStack_6c0;
      uStack_684 = local_688;
      uStack_680 = local_688;
      uStack_67c = local_688;
      uStack_664 = local_668;
      uStack_660 = local_668;
      uStack_65c = local_668;
      local_648 = local_6d8;
      uStack_640 = uStack_6d0;
      local_628 = local_6d8;
      uStack_620 = uStack_6d0;
      local_618 = local_6b8;
      uStack_610 = uStack_6b0;
      uStack_5b4 = local_5b8;
      uStack_5b0 = local_5b8;
      uStack_5ac = local_5b8;
      local_518 = local_598;
      uStack_510 = uStack_590;
      local_4e8 = local_578;
      uStack_4e0 = uStack_570;
      local_468 = local_598;
      uStack_460 = uStack_590;
      local_438 = local_448;
      uStack_430 = uStack_440;
      local_418 = uVar1;
      uStack_410 = uVar2;
      local_378 = local_608;
      uStack_370 = uStack_600;
      local_300 = local_360;
      local_2f0 = local_350;
      local_2a0 = local_360;
      local_238 = local_360;
      local_230 = local_290;
      local_1d8 = local_360;
      local_1d0 = local_290;
      local_178 = local_360;
      local_170 = local_290;
      local_118 = local_360;
      local_110 = local_290;
      local_b8 = local_360;
      local_b0 = local_290;
      local_18 = local_608;
      uStack_10 = uStack_600;
    }
    for (; local_844 < local_7ec; local_844 = local_844 + 1) {
      local_6e0 = local_7d1;
      local_6e8 = local_7f8;
      fVar7 = tanhf(*local_7f8);
      *local_7f8 = fVar7;
      local_7f8 = local_7f8 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}